

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_adopt_socket_vhost(lws_vhost *vh,lws_sockfd_type accept_fd)

{
  lws *plVar1;
  lws_sock_file_fd_type fd;
  lws_sockfd_type accept_fd_local;
  lws_vhost *vh_local;
  
  plVar1 = lws_adopt_descriptor_vhost
                     (vh,LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP,
                      (lws_sock_file_fd_type)accept_fd,(char *)0x0,(lws *)0x0);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_socket_vhost(struct lws_vhost *vh, lws_sockfd_type accept_fd)
{
	lws_sock_file_fd_type fd;

	fd.sockfd = accept_fd;
	return lws_adopt_descriptor_vhost(vh, LWS_ADOPT_SOCKET |
			LWS_ADOPT_HTTP | LWS_ADOPT_ALLOW_SSL, fd, NULL, NULL);
}